

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_function_object.cpp
# Opt level: O3

void test_main(void)

{
  pointer ppuVar1;
  pointer ppuVar2;
  version vVar3;
  char *pcVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  gc_heap *pgVar8;
  ulong *puVar9;
  ulong uVar10;
  char *pcVar11;
  string __str;
  string expected_keys;
  gc_heap h;
  undefined1 local_1b8 [8];
  undefined1 local_1b0 [32];
  wstring_view local_190;
  ulong local_180;
  long lStack_178;
  string_view local_170;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120 [2];
  gc_heap_ptr_untyped local_110;
  undefined1 local_100 [16];
  slot *local_f0 [2];
  slot local_e0 [2];
  string_view local_d0;
  string_view local_c0;
  gc_heap_ptr_untyped local_b0;
  gc_heap local_a0;
  
  mjs::gc_heap::gc_heap(&local_a0,0x100);
  vVar3 = tested_version();
  pcVar11 = "";
  pcVar4 = "";
  if (vVar3 == es3) {
    pcVar4 = "prototype,";
  }
  local_1b8 = (undefined1  [8])10;
  if (vVar3 != es3) {
    local_1b8 = (undefined1  [8])0;
  }
  local_1b0._0_8_ = pcVar4;
  mjs::string::string((string *)&local_b0,&local_a0,(string_view *)local_1b8);
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                     ,10);
  local_190._M_len = 0x32;
  local_190._M_str = L"s=\'\'; function a(){}; for(k in a) { s+=k+\',\'; }; s";
  local_1b8._0_4_ = 4;
  local_1b0._0_8_ = local_b0.heap_;
  local_1b0._8_4_ = local_b0.pos_;
  if (local_b0.heap_ != (gc_heap *)0x0) {
    mjs::gc_heap::attach(local_b0.heap_,(gc_heap_ptr_untyped *)local_1b0);
  }
  run_test(&local_190,(value *)local_1b8);
  mjs::value::destroy((value *)local_1b8);
  local_d0._M_len = 0x227;
  local_d0._M_str =
       "\nfunction a(x,y,z){};\ndelete a.length; //$boolean false\na.length;//$number 3\ndelete a.prototype.constructor; //$boolean true\nFunction.prototype(1,2,3); //$undefined\nFunction.toString(); //$string \'function Function() { [native code] }\'\nFunction.prototype.toString(); //$string \'function () { [native code] }\'\n\nfunction f() { return this; }\nf() == global; //$boolean true\nf(undefined) == global; //$boolean true\nf(null) == global; //$boolean true\nNumber.prototype.toString = f;\nn=(42).toString();\ntypeof n; //$string \'object\'\nn.valueOf(); //$number 42\n"
  ;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_170._M_len = (size_t)&local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  pgVar8 = (gc_heap *)(plVar5 + 2);
  if ((gc_heap *)*plVar5 == pgVar8) {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_100._8_8_ = plVar5[3];
    local_110.heap_ = (gc_heap *)local_100;
  }
  else {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_110.heap_ = (gc_heap *)*plVar5;
  }
  local_110._8_8_ = plVar5[1];
  *plVar5 = (long)pgVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar5[3];
    local_190._M_len = (size_t)&local_180;
  }
  else {
    local_180 = *puVar9;
    local_190._M_len = (size_t)*plVar5;
  }
  local_190._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,'\x02');
  *(undefined2 *)local_130 = 0x3932;
  uVar10 = 0xf;
  if ((ulong *)local_190._M_len != &local_180) {
    uVar10 = local_180;
  }
  if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_00112b58;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
  }
  else {
LAB_00112b58:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
  }
  local_1b8 = (undefined1  [8])(local_1b0 + 8);
  ppuVar1 = (pointer)(puVar6 + 2);
  if ((pointer)*puVar6 == ppuVar1) {
    local_1b0._8_8_ = *ppuVar1;
    local_1b0._16_8_ = puVar6[3];
  }
  else {
    local_1b0._8_8_ = *ppuVar1;
    local_1b8 = (undefined1  [8])*puVar6;
  }
  local_1b0._0_8_ = puVar6[1];
  *puVar6 = ppuVar1;
  puVar6[1] = 0;
  *(undefined1 *)ppuVar1 = 0;
  local_c0._M_str = (char *)local_1b8;
  local_c0._M_len = local_1b0._0_8_;
  mjs::run_test_spec(&local_d0,&local_c0);
  ppuVar1 = (pointer)(local_1b0 + 8);
  if (local_1b8 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if ((ulong *)local_190._M_len != &local_180) {
    operator_delete((void *)local_190._M_len,local_180 + 1);
  }
  if (local_110.heap_ != (gc_heap *)local_100) {
    operator_delete(local_110.heap_,local_100._0_8_ + 1);
  }
  if ((long *)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0].representation + 1);
  }
  vVar3 = tested_version();
  if ((int)vVar3 < 1) {
    local_d0._M_len = 0x50;
    local_d0._M_str =
         "\nfunction a(x,y,z){};\ndelete a.arguments; //$boolean false\na.arguments; //$null\n";
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
    local_150 = &local_140;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_140 = *plVar7;
      lStack_138 = plVar5[3];
    }
    else {
      local_140 = *plVar7;
      local_150 = (long *)*plVar5;
    }
    local_148 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_170._M_len = (size_t)&local_160;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_160 = *plVar7;
      lStack_158 = plVar5[3];
    }
    else {
      local_160 = *plVar7;
      local_170._M_len = (size_t)*plVar5;
    }
    local_170._M_str = (char *)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    pgVar8 = (gc_heap *)(plVar5 + 2);
    if ((gc_heap *)*plVar5 == pgVar8) {
      local_100._0_8_ = (pgVar8->pointers_).set_;
      local_100._8_8_ = plVar5[3];
      local_110.heap_ = (gc_heap *)local_100;
    }
    else {
      local_100._0_8_ = (pgVar8->pointers_).set_;
      local_110.heap_ = (gc_heap *)*plVar5;
    }
    local_110._8_8_ = plVar5[1];
    *plVar5 = (long)pgVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_180 = *puVar9;
      lStack_178 = plVar5[3];
      local_190._M_len = (size_t)&local_180;
    }
    else {
      local_180 = *puVar9;
      local_190._M_len = (size_t)*plVar5;
    }
    local_190._M_str = (wchar_t *)plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_130 = local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,'\x02');
    *(undefined2 *)local_130 = 0x3733;
    uVar10 = 0xf;
    if ((ulong *)local_190._M_len != &local_180) {
      uVar10 = local_180;
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
      uVar10 = 0xf;
      if (local_130 != local_120) {
        uVar10 = local_120[0];
      }
      if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_00112ec8;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
    }
    else {
LAB_00112ec8:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
    }
    ppuVar2 = (pointer)(puVar6 + 2);
    if ((pointer)*puVar6 == ppuVar2) {
      local_1b0._8_8_ = *ppuVar2;
      local_1b0._16_8_ = puVar6[3];
      local_1b8 = (undefined1  [8])ppuVar1;
    }
    else {
      local_1b0._8_8_ = *ppuVar2;
      local_1b8 = (undefined1  [8])*puVar6;
    }
    local_1b0._0_8_ = puVar6[1];
    *puVar6 = ppuVar2;
    puVar6[1] = 0;
    *(undefined1 *)ppuVar2 = 0;
    local_c0._M_str = (char *)local_1b8;
    local_c0._M_len = local_1b0._0_8_;
    mjs::run_test_spec(&local_d0,&local_c0);
    if (local_1b8 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
    }
    if (local_130 != local_120) {
      operator_delete(local_130,local_120[0] + 1);
    }
    if ((ulong *)local_190._M_len != &local_180) {
      operator_delete((void *)local_190._M_len,local_180 + 1);
    }
    if (local_110.heap_ != (gc_heap *)local_100) {
      operator_delete(local_110.heap_,local_100._0_8_ + 1);
    }
    if ((long *)local_170._M_len != &local_160) {
      operator_delete((void *)local_170._M_len,local_160 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0].representation + 1);
    }
  }
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                     ,0x2a);
  local_190._M_len = 0x2c;
  local_190._M_str = L"function a(){}; s=\'\'; for(k in a)s+=k+\',\'; s";
  vVar3 = tested_version();
  if (vVar3 == es3) {
    pcVar11 = "prototype,";
  }
  local_170._M_len = (size_t)(long *)0xa;
  if (vVar3 != es3) {
    local_170._M_len = (size_t)(long *)0x0;
  }
  local_170._M_str = pcVar11;
  mjs::string::string((string *)&local_110,&local_a0,&local_170);
  local_1b8._0_4_ = 4;
  local_1b0._0_8_ = local_110.heap_;
  local_1b0._8_4_ = local_110.pos_;
  if (local_110.heap_ != (gc_heap *)0x0) {
    mjs::gc_heap::attach(local_110.heap_,(gc_heap_ptr_untyped *)local_1b0);
  }
  run_test(&local_190,(value *)local_1b8);
  mjs::value::destroy((value *)local_1b8);
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  vVar3 = tested_version();
  if ((int)vVar3 < 2) {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x2d);
    local_1b8 = (undefined1  [8])0x17;
    local_1b0._0_8_ = L"Function.prototype.bind";
    run_test((wstring_view *)local_1b8,(value *)&mjs::value::undefined);
  }
  vVar3 = tested_version();
  if ((int)vVar3 < 1) {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x32);
    local_190._M_len = 0x24;
    local_190._M_str = L"function a(){}; (delete a.prototype)";
    local_1b8._0_4_ = 2;
    local_1b0[0] = 1;
    run_test(&local_190,(value *)local_1b8);
    mjs::value::destroy((value *)local_1b8);
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x34);
    local_1b8 = (undefined1  [8])0x32;
    local_1b0._0_8_ = L"fp = Function.prototype; fp[\'call\'] || fp[\'apply\']";
    run_test((wstring_view *)local_1b8,(value *)&mjs::value::undefined);
    goto LAB_001147ed;
  }
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                     ,0x39);
  local_190._M_len = 0x24;
  local_190._M_str = L"function a(){}; (delete a.prototype)";
  local_1b8._0_4_ = boolean;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  run_test(&local_190,(value *)local_1b8);
  mjs::value::destroy((value *)local_1b8);
  run_test_debug_pos("test_main",
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                     ,0x3c);
  local_190._M_len = 0x31;
  local_190._M_str = L"function f(){ f=42; return f==42||delete f;}; f()";
  local_1b8._0_4_ = 2;
  local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffffffffff00;
  run_test(&local_190,(value *)local_1b8);
  mjs::value::destroy((value *)local_1b8);
  local_d0._M_len = 599;
  local_d0._M_str =
       "\nFunction.prototype.apply.length; //$number 2\nfunction f(a,b,c) { return \'\'+this[\'x\']+a+b+c; }\nx=42;\nf.apply(); //$string \'42undefinedundefinedundefined\'\nf.apply(null); //$string \'42undefinedundefinedundefined\'\nf.apply({}); //$string \'undefinedundefinedundefinedundefined\'\nf.apply({x:60},[\'a\',\'b\']); //$string \'60abundefined\'\nf.apply({x:\'z\'},[1,2,3,4]); //$string \'z123\'\n\nString.prototype.charAt.apply(\'test\',[2]); //$string \'s\'\n\nString.prototype.apply = Function.prototype.apply;\ntry { (\'h\').apply(); } catch (e) {\n    e.toString().toLowerCase(); //$ string \'typeerror: string is not a function\'\n}\n"
  ;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_170._M_len = (size_t)&local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  pgVar8 = (gc_heap *)(plVar5 + 2);
  if ((gc_heap *)*plVar5 == pgVar8) {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_100._8_8_ = plVar5[3];
    local_110.heap_ = (gc_heap *)local_100;
  }
  else {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_110.heap_ = (gc_heap *)*plVar5;
  }
  local_110._8_8_ = plVar5[1];
  *plVar5 = (long)pgVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar5[3];
    local_190._M_len = (size_t)&local_180;
  }
  else {
    local_180 = *puVar9;
    local_190._M_len = (size_t)*plVar5;
  }
  local_190._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,'\x02');
  *(undefined2 *)local_130 = 0x3837;
  uVar10 = 0xf;
  if ((ulong *)local_190._M_len != &local_180) {
    uVar10 = local_180;
  }
  if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_00113447;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
  }
  else {
LAB_00113447:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
  }
  ppuVar2 = (pointer)(puVar6 + 2);
  if ((pointer)*puVar6 == ppuVar2) {
    local_1b0._8_8_ = *ppuVar2;
    local_1b0._16_8_ = puVar6[3];
    local_1b8 = (undefined1  [8])ppuVar1;
  }
  else {
    local_1b0._8_8_ = *ppuVar2;
    local_1b8 = (undefined1  [8])*puVar6;
  }
  local_1b0._0_8_ = puVar6[1];
  *puVar6 = ppuVar2;
  puVar6[1] = 0;
  *(undefined1 *)ppuVar2 = 0;
  local_c0._M_str = (char *)local_1b8;
  local_c0._M_len = local_1b0._0_8_;
  mjs::run_test_spec(&local_d0,&local_c0);
  if (local_1b8 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if ((ulong *)local_190._M_len != &local_180) {
    operator_delete((void *)local_190._M_len,local_180 + 1);
  }
  if (local_110.heap_ != (gc_heap *)local_100) {
    operator_delete(local_110.heap_,local_100._0_8_ + 1);
  }
  if ((long *)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0].representation + 1);
  }
  local_d0._M_len = 0x247;
  local_d0._M_str =
       "\nFunction.prototype.call.length; //$number 1\nfunction f(a,b,c) { return \'\'+this[\'x\']+a+b+c; }\nx=42;\nf.call(); //$string \'42undefinedundefinedundefined\'\nf.call(null); //$string \'42undefinedundefinedundefined\'\nf.call({}); //$string \'undefinedundefinedundefinedundefined\'\nf.call({x:60},\'a\',\'b\'); //$string \'60abundefined\'\nf.call({x:\'z\'},1,2,3,4); //$string \'z123\'\n\nString.prototype.charAt.call(\'test\',2); //$string \'s\'\n\nString.prototype.call = Function.prototype.call;\ntry { (\'h\').call(); } catch (e) {\n    e.toString().toLowerCase(); //$ string \'typeerror: string is not a function\'\n}\n"
  ;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_170._M_len = (size_t)&local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  pgVar8 = (gc_heap *)(plVar5 + 2);
  if ((gc_heap *)*plVar5 == pgVar8) {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_100._8_8_ = plVar5[3];
    local_110.heap_ = (gc_heap *)local_100;
  }
  else {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_110.heap_ = (gc_heap *)*plVar5;
  }
  local_110._8_8_ = plVar5[1];
  *plVar5 = (long)pgVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar5[3];
    local_190._M_len = (size_t)&local_180;
  }
  else {
    local_180 = *puVar9;
    local_190._M_len = (size_t)*plVar5;
  }
  local_190._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,'\x02');
  *(undefined2 *)local_130 = 0x3639;
  uVar10 = 0xf;
  if ((ulong *)local_190._M_len != &local_180) {
    uVar10 = local_180;
  }
  if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_001137a1;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
  }
  else {
LAB_001137a1:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
  }
  ppuVar2 = (pointer)(puVar6 + 2);
  if ((pointer)*puVar6 == ppuVar2) {
    local_1b0._8_8_ = *ppuVar2;
    local_1b0._16_8_ = puVar6[3];
    local_1b8 = (undefined1  [8])ppuVar1;
  }
  else {
    local_1b0._8_8_ = *ppuVar2;
    local_1b8 = (undefined1  [8])*puVar6;
  }
  local_1b0._0_8_ = puVar6[1];
  *puVar6 = ppuVar2;
  puVar6[1] = 0;
  *(undefined1 *)ppuVar2 = 0;
  local_c0._M_str = (char *)local_1b8;
  local_c0._M_len = local_1b0._0_8_;
  mjs::run_test_spec(&local_d0,&local_c0);
  if (local_1b8 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if ((ulong *)local_190._M_len != &local_180) {
    operator_delete((void *)local_190._M_len,local_180 + 1);
  }
  if (local_110.heap_ != (gc_heap *)local_100) {
    operator_delete(local_110.heap_,local_100._0_8_ + 1);
  }
  if ((long *)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0].representation + 1);
  }
  local_d0._M_len = 0x59f;
  local_d0._M_str =
       "\n// ES3, 15.3.2.1\ntry {new Function(\'a;b\',\'return a+b\');} catch (e) { e.toString(); } //$string \'SyntaxError: Invalid argument to function constructor\'\ntry {new Function(\'a,b\',\'*a\');} catch (e) { e.toString(); } //$string \'SyntaxError: Invalid argument to function constructor\'\n\n// ES3, 11.2.2, 11.2.3\ntry {new 42;} catch (e) { e.toString(); } //$string \'TypeError: 42 is not an object\'\ntry {({})();} catch (e) { e.toString(); } //$string \'TypeError: Object is not a function\'\ntry {42();} catch (e) { e.toString(); } //$string \'TypeError: 42 is not a function\'\n\n// ES3, 15.3.4.2\ntry { Function.prototype.toString.call(42); } catch (e) { e.toString().toLowerCase(); } //$string \'typeerror: number is not a function\'\n\n// ES3, 15.3.4.3\no = {}\no.apply = Function.prototype.apply;\ntry { o.apply(); } catch (e) { e.toString(); } //$string \'TypeError: Object is not a function\'\n\nfunction g(a,b) { return \'(\'+a+\';\'+b+\')\'; }\nfunction f() { return g.apply(null, arguments); }\nf(1,2); //$string \'(1;2)\'\ng.apply(null, [3,4]); //$string \'(3;4)\'\n\n// ES3, 15.3.4.4\no = {}\no.call = Function.prototype.call;\ntry { o.call(); } catch (e) { e.toString(); } //$string \'TypeError: Object is not a function\'\n\n// ES3, 15.3.5.3\nfunction f() {}\nfi = new f();\nfi instanceof f; //$boolean true\nf.prototype = undefined;\ntry { fi instanceof f; } catch (e) { e.toString(); } //$string \'TypeError: Function has non-object prototype of type undefined in instanceof check\'\n"
  ;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_170._M_len = (size_t)&local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  pgVar8 = (gc_heap *)(plVar5 + 2);
  if ((gc_heap *)*plVar5 == pgVar8) {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_100._8_8_ = plVar5[3];
    local_110.heap_ = (gc_heap *)local_100;
  }
  else {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_110.heap_ = (gc_heap *)*plVar5;
  }
  local_110._8_8_ = plVar5[1];
  *plVar5 = (long)pgVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar5[3];
    local_190._M_len = (size_t)&local_180;
  }
  else {
    local_180 = *puVar9;
    local_190._M_len = (size_t)*plVar5;
  }
  local_190._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_130,3,0x84);
  uVar10 = 0xf;
  if ((ulong *)local_190._M_len != &local_180) {
    uVar10 = local_180;
  }
  if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_00113b05;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
  }
  else {
LAB_00113b05:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
  }
  ppuVar2 = (pointer)(puVar6 + 2);
  if ((pointer)*puVar6 == ppuVar2) {
    local_1b0._8_8_ = *ppuVar2;
    local_1b0._16_8_ = puVar6[3];
    local_1b8 = (undefined1  [8])ppuVar1;
  }
  else {
    local_1b0._8_8_ = *ppuVar2;
    local_1b8 = (undefined1  [8])*puVar6;
  }
  local_1b0._0_8_ = puVar6[1];
  *puVar6 = ppuVar2;
  puVar6[1] = 0;
  *(undefined1 *)ppuVar2 = 0;
  local_c0._M_str = (char *)local_1b8;
  local_c0._M_len = local_1b0._0_8_;
  mjs::run_test_spec(&local_d0,&local_c0);
  if (local_1b8 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if ((ulong *)local_190._M_len != &local_180) {
    operator_delete((void *)local_190._M_len,local_180 + 1);
  }
  if (local_110.heap_ != (gc_heap *)local_100) {
    operator_delete(local_110.heap_,local_100._0_8_ + 1);
  }
  if ((long *)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0].representation + 1);
  }
  vVar3 = tested_version();
  if ((int)vVar3 < 2) {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x89);
    local_190._M_len = 0x5b;
    local_190._M_str =
         L"try { Number.prototype.toString.apply(42, {\'length\':1,0:16}); } catch (e) { e.toString(); }"
    ;
    local_170._M_len = 0x2d;
    local_170._M_str = "TypeError: Object is not an (arguments) array";
    mjs::string::string((string *)&local_110,&local_a0,&local_170);
    local_1b8._0_4_ = 4;
    local_1b0._0_8_ = local_110.heap_;
    local_1b0._8_4_ = local_110.pos_;
    if (local_110.heap_ != (gc_heap *)0x0) {
      mjs::gc_heap::attach(local_110.heap_,(gc_heap_ptr_untyped *)local_1b0);
    }
    run_test(&local_190,(value *)local_1b8);
    mjs::value::destroy((value *)local_1b8);
  }
  else {
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_function_object.cpp"
                       ,0x8c);
    local_190._M_len = 0x5b;
    local_190._M_str =
         L"try { Number.prototype.toString.apply(42, {\'length\':1,0:16}); } catch (e) { e.toString(); }"
    ;
    local_170._M_len = 2;
    local_170._M_str = "2a";
    mjs::string::string((string *)&local_110,&local_a0,&local_170);
    local_1b8._0_4_ = 4;
    local_1b0._0_8_ = local_110.heap_;
    local_1b0._8_4_ = local_110.pos_;
    if (local_110.heap_ != (gc_heap *)0x0) {
      mjs::gc_heap::attach(local_110.heap_,(gc_heap_ptr_untyped *)local_1b0);
    }
    run_test(&local_190,(value *)local_1b8);
    mjs::value::destroy((value *)local_1b8);
  }
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_110);
  vVar3 = tested_version();
  if (1 < (int)vVar3) {
    local_d0._M_len = 0x6cc;
    local_d0._M_str =
         "\nFunction.prototype.bind.length;//$number 1\ntry { Function.prototype.bind.call(new String(\'\'),42); } catch (e) { e.toString(); } //$string \'TypeError: String is not a function\'\nfunction f(){};\nf.prototype = Function.prototype;\nvar fi = new f();\ntry { fi.bind(); } catch (e) { e.toString(); } //$string \'TypeError: f is not a function\'\n\nr = (function(){return this}).bind()(); r === global; //$boolean true\nr = (function(){return this}).bind()(undefined); r === global; //$boolean true\nr = (function(){return this}).bind()(null); r === global; //$boolean true\na=(function(){return this}).bind(42);\na.length;//$number 0\nr=a(); r instanceof Number; //$boolean true\nr.valueOf(); //$ number 42\nadd1=(function(x,y){return x+y;}).bind(undefined,1);\nadd1(42);//$number 43\nadd1(\'x \');//$string \'1x \'\nadd1.length;//$number 1\nadd12=add1.bind(2,3);\nadd12(4); //$number 4\nadd12.length;//$number 0\nadd12x=add12.bind(4,5);\nadd12x(4); //$number 4\nadd12x.length;//$number 0\n\nadd2=(function(x,y){return x+y;}).bind(undefined,1,2,3);\nadd2(42); //$number 3\nadd2.length; //$number 0\n\nfunction fmt(v) { return v+\':\'+typeof v; }\nfunction fmtall(o) { var r = \'{\'; var p = Object.getOwnPropertyNames(o);for(var i=0;i<p.length;++i) { r+=\' \'+p[i]+\'=\'+fmt(o[p[i]]); }; return r+\'}\'; }\nfunction f(a,b) { s+=\'this=\'+fmtall(this)+\',arguments=\'+fmtall(arguments); this.x=a; this.y=b; };\ns = \'\'; x = f.bind(new String(\'x\'),new String(\'y\'));\ns; //$string \'\'\nr=new x(42,43,44);\ns; //$string \'this={},arguments={ length=4:number 0=y:object 1=42:number 2=43:number 3=44:number callee=function f(a,b) { s+=\\\'this=\\\'+fmtall(this)+\\\',arguments=\\\'+fmtall(arguments); this.x=a; this.y=b; }:function}\'\nr instanceof f; //$boolean true\nfmtall(r); //$string \'{ x=y:object y=42:number}\'\n"
    ;
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
    local_150 = &local_140;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_140 = *plVar7;
      lStack_138 = plVar5[3];
    }
    else {
      local_140 = *plVar7;
      local_150 = (long *)*plVar5;
    }
    local_148 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_170._M_len = (size_t)&local_160;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_160 = *plVar7;
      lStack_158 = plVar5[3];
    }
    else {
      local_160 = *plVar7;
      local_170._M_len = (size_t)*plVar5;
    }
    local_170._M_str = (char *)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    pgVar8 = (gc_heap *)(plVar5 + 2);
    if ((gc_heap *)*plVar5 == pgVar8) {
      local_100._0_8_ = (pgVar8->pointers_).set_;
      local_100._8_8_ = plVar5[3];
      local_110.heap_ = (gc_heap *)local_100;
    }
    else {
      local_100._0_8_ = (pgVar8->pointers_).set_;
      local_110.heap_ = (gc_heap *)*plVar5;
    }
    local_110._8_8_ = plVar5[1];
    *plVar5 = (long)pgVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_180 = *puVar9;
      lStack_178 = plVar5[3];
      local_190._M_len = (size_t)&local_180;
    }
    else {
      local_180 = *puVar9;
      local_190._M_len = (size_t)*plVar5;
    }
    local_190._M_str = (wchar_t *)plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_130 = local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,'\x03');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_130,3,0xb9);
    uVar10 = 0xf;
    if ((ulong *)local_190._M_len != &local_180) {
      uVar10 = local_180;
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
      uVar10 = 0xf;
      if (local_130 != local_120) {
        uVar10 = local_120[0];
      }
      if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_00113fcf;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
    }
    else {
LAB_00113fcf:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
    }
    ppuVar2 = (pointer)(puVar6 + 2);
    if ((pointer)*puVar6 == ppuVar2) {
      local_1b0._8_8_ = *ppuVar2;
      local_1b0._16_8_ = puVar6[3];
      local_1b8 = (undefined1  [8])ppuVar1;
    }
    else {
      local_1b0._8_8_ = *ppuVar2;
      local_1b8 = (undefined1  [8])*puVar6;
    }
    local_1b0._0_8_ = puVar6[1];
    *puVar6 = ppuVar2;
    puVar6[1] = 0;
    *(undefined1 *)ppuVar2 = 0;
    local_c0._M_str = (char *)local_1b8;
    local_c0._M_len = local_1b0._0_8_;
    mjs::run_test_spec(&local_d0,&local_c0);
    if (local_1b8 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
    }
    if (local_130 != local_120) {
      operator_delete(local_130,local_120[0] + 1);
    }
    if ((ulong *)local_190._M_len != &local_180) {
      operator_delete((void *)local_190._M_len,local_180 + 1);
    }
    if (local_110.heap_ != (gc_heap *)local_100) {
      operator_delete(local_110.heap_,local_100._0_8_ + 1);
    }
    if ((long *)local_170._M_len != &local_160) {
      operator_delete((void *)local_170._M_len,local_160 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0].representation + 1);
    }
    local_d0._M_len = 0x54f;
    local_d0._M_str =
         "\ntry { (function(){\'use strict\'; return arguments.callee;})() } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\ntry { (function(){\'use strict\'; arguments.callee = 42;})()   } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\ntry { (function(){\'use strict\'; return arguments.caller;})() } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\ntry { (function(){\'use strict\'; arguments.caller = 42;})()   } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n\nfunction f(){};\n(function(){\'use strict\'; f.callee=42; return f.callee; })(); //$number 42\n(function(){\'use strict\'; f.caller=55; return f.caller; })(); //$number 55\n\n(function(){\n    \'use strict\';\n    function g(){};\n    try { g.arguments;      } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n    try { g.arguments = 42; } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n    try { g.caller;         } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n    try { g.caller = 42;    } catch (e) { e.toString(); } //$string \'TypeError: Property may not be accessed in strict mode\'\n})();\n\n"
    ;
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
    local_150 = &local_140;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_140 = *plVar7;
      lStack_138 = plVar5[3];
    }
    else {
      local_140 = *plVar7;
      local_150 = (long *)*plVar5;
    }
    local_148 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
    local_170._M_len = (size_t)&local_160;
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_160 = *plVar7;
      lStack_158 = plVar5[3];
    }
    else {
      local_160 = *plVar7;
      local_170._M_len = (size_t)*plVar5;
    }
    local_170._M_str = (char *)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
    pgVar8 = (gc_heap *)(plVar5 + 2);
    if ((gc_heap *)*plVar5 == pgVar8) {
      local_100._0_8_ = (pgVar8->pointers_).set_;
      local_100._8_8_ = plVar5[3];
      local_110.heap_ = (gc_heap *)local_100;
    }
    else {
      local_100._0_8_ = (pgVar8->pointers_).set_;
      local_110.heap_ = (gc_heap *)*plVar5;
    }
    local_110._8_8_ = plVar5[1];
    *plVar5 = (long)pgVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_180 = *puVar9;
      lStack_178 = plVar5[3];
      local_190._M_len = (size_t)&local_180;
    }
    else {
      local_180 = *puVar9;
      local_190._M_len = (size_t)*plVar5;
    }
    local_190._M_str = (wchar_t *)plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    local_130 = local_120;
    std::__cxx11::string::_M_construct((ulong)&local_130,'\x03');
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_130,3,0xce);
    uVar10 = 0xf;
    if ((ulong *)local_190._M_len != &local_180) {
      uVar10 = local_180;
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
      uVar10 = 0xf;
      if (local_130 != local_120) {
        uVar10 = local_120[0];
      }
      if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_00114333;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
    }
    else {
LAB_00114333:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
    }
    ppuVar2 = (pointer)(puVar6 + 2);
    if ((pointer)*puVar6 == ppuVar2) {
      local_1b0._8_8_ = *ppuVar2;
      local_1b0._16_8_ = puVar6[3];
      local_1b8 = (undefined1  [8])ppuVar1;
    }
    else {
      local_1b0._8_8_ = *ppuVar2;
      local_1b8 = (undefined1  [8])*puVar6;
    }
    local_1b0._0_8_ = puVar6[1];
    *puVar6 = ppuVar2;
    puVar6[1] = 0;
    *(undefined1 *)ppuVar2 = 0;
    local_c0._M_str = (char *)local_1b8;
    local_c0._M_len = local_1b0._0_8_;
    mjs::run_test_spec(&local_d0,&local_c0);
    if (local_1b8 != (undefined1  [8])ppuVar1) {
      operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
    }
    if (local_130 != local_120) {
      operator_delete(local_130,local_120[0] + 1);
    }
    if ((ulong *)local_190._M_len != &local_180) {
      operator_delete((void *)local_190._M_len,local_180 + 1);
    }
    if (local_110.heap_ != (gc_heap *)local_100) {
      operator_delete(local_110.heap_,local_100._0_8_ + 1);
    }
    if ((long *)local_170._M_len != &local_160) {
      operator_delete((void *)local_170._M_len,local_160 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if (local_f0[0] != local_e0) {
      operator_delete(local_f0[0],local_e0[0].representation + 1);
    }
  }
  vVar3 = tested_version();
  if ((int)vVar3 < 2) goto LAB_001147ed;
  local_d0._M_len = 0x5fc;
  local_d0._M_str =
       "\n(function() {\n    \'use strict\';\n    var q;\n    Object.defineProperty(Number.prototype, \'foo\', {\n        configurable: true,\n        get: function() { return this; },\n        set: function() { q=this; },\n    });\n    var x = 60;\n    x.foo; //$number 60\n    q;//$undefined\n    x.foo *= 2;\n    q;//$number 60\n})();\n\n(function() {\n    \'use strict\';\n    var q;\n    Object.defineProperty(Boolean.prototype, \'foo\', {\n        configurable: true,\n        get: function() { return this; },\n        set: function() { q=this; },\n    });\n    var x = true;\n    x.foo; //$boolean true\n    q;//$undefined\n    x.foo *= 2;\n    q;//$boolean true\n})();\n\n(function() {\n    \'use strict\';\n    var q;\n    Object.defineProperty(String.prototype, \'foo\', {\n        configurable: true,\n        get: function() { return this; },\n        set: function() { q=this; },\n    });\n    var x = \'test\';\n    x.foo; //$string \'test\'\n    q;//$undefined\n    x.foo *= 2;\n    q;//$string \'test\'\n})();\n\nfunction f() { \"use strict\"; return this; }\nf(); //$undefined\nf(undefined); //$undefined\nNumber.prototype.toString = f;\nn=(42+1).toString();\ntypeof n; //$string \'number\'\nn === 43; //$boolean true\nn.valueOf(); //$number 43\n\nf.apply(); //$undefined\nf.apply(undefined); //$undefined\n// maybe undefined???\nf.apply(null); //$null\nf.apply(false); //$boolean false\nf.apply(60); //$number 60\nf.apply(\'x\'); //$string \'x\'\n\nf.call(); //$undefined\nf.call(undefined); //$undefined\nf.call(null); //$null\nf.call(false); //$boolean false\nf.call(60); //$number 60\nf.call(\'x\'); //$string \'x\'\n"
  ;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"testspec@","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_f0);
  local_150 = &local_140;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_140 = *plVar7;
    lStack_138 = plVar5[3];
  }
  else {
    local_140 = *plVar7;
    local_150 = (long *)*plVar5;
  }
  local_148 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_170._M_len = (size_t)&local_160;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_160 = *plVar7;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar7;
    local_170._M_len = (size_t)*plVar5;
  }
  local_170._M_str = (char *)plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
  pgVar8 = (gc_heap *)(plVar5 + 2);
  if ((gc_heap *)*plVar5 == pgVar8) {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_100._8_8_ = plVar5[3];
    local_110.heap_ = (gc_heap *)local_100;
  }
  else {
    local_100._0_8_ = (pgVar8->pointers_).set_;
    local_110.heap_ = (gc_heap *)*plVar5;
  }
  local_110._8_8_ = plVar5[1];
  *plVar5 = (long)pgVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  puVar9 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar9) {
    local_180 = *puVar9;
    lStack_178 = plVar5[3];
    local_190._M_len = (size_t)&local_180;
  }
  else {
    local_180 = *puVar9;
    local_190._M_len = (size_t)*plVar5;
  }
  local_190._M_str = (wchar_t *)plVar5[1];
  *plVar5 = (long)puVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  local_130 = local_120;
  std::__cxx11::string::_M_construct((ulong)&local_130,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_130,3,0x11a);
  uVar10 = 0xf;
  if ((ulong *)local_190._M_len != &local_180) {
    uVar10 = local_180;
  }
  if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) {
    uVar10 = 0xf;
    if (local_130 != local_120) {
      uVar10 = local_120[0];
    }
    if (uVar10 < (ulong)(local_128 + (long)local_190._M_str)) goto LAB_001146a5;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,local_190._M_len);
  }
  else {
LAB_001146a5:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_190,(ulong)local_130);
  }
  ppuVar2 = (pointer)(puVar6 + 2);
  if ((pointer)*puVar6 == ppuVar2) {
    local_1b0._8_8_ = *ppuVar2;
    local_1b0._16_8_ = puVar6[3];
    local_1b8 = (undefined1  [8])ppuVar1;
  }
  else {
    local_1b0._8_8_ = *ppuVar2;
    local_1b8 = (undefined1  [8])*puVar6;
  }
  local_1b0._0_8_ = puVar6[1];
  *puVar6 = ppuVar2;
  puVar6[1] = 0;
  *(undefined1 *)ppuVar2 = 0;
  local_c0._M_str = (char *)local_1b8;
  local_c0._M_len = local_1b0._0_8_;
  mjs::run_test_spec(&local_d0,&local_c0);
  if (local_1b8 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_1b8,local_1b0._8_8_ + 1);
  }
  if (local_130 != local_120) {
    operator_delete(local_130,local_120[0] + 1);
  }
  if ((ulong *)local_190._M_len != &local_180) {
    operator_delete((void *)local_190._M_len,local_180 + 1);
  }
  if (local_110.heap_ != (gc_heap *)local_100) {
    operator_delete(local_110.heap_,local_100._0_8_ + 1);
  }
  if ((long *)local_170._M_len != &local_160) {
    operator_delete((void *)local_170._M_len,local_160 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0].representation + 1);
  }
LAB_001147ed:
  mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_b0);
  mjs::gc_heap::~gc_heap(&local_a0);
  return;
}

Assistant:

void test_main() {
    gc_heap h{256};
    // In ES3 prototype only has attributes DontDelete, in ES1 it's DontEnum
    const string expected_keys{h, tested_version() != version::es3 ? "" : "prototype,"};
    RUN_TEST(L"s=''; function a(){}; for(k in a) { s+=k+','; }; s", value{expected_keys});
    // length and are arguments should be DontDelete|DontEnum|ReadOnly
    RUN_TEST_SPEC(R"(
function a(x,y,z){};
delete a.length; //$boolean false
a.length;//$number 3
delete a.prototype.constructor; //$boolean true
Function.prototype(1,2,3); //$undefined
Function.toString(); //$string 'function Function() { [native code] }'
Function.prototype.toString(); //$string 'function () { [native code] }'

function f() { return this; }
f() == global; //$boolean true
f(undefined) == global; //$boolean true
f(null) == global; //$boolean true
Number.prototype.toString = f;
n=(42).toString();
typeof n; //$string 'object'
n.valueOf(); //$number 42
)");

    // No "arguments" in ES3+
    if (tested_version() < version::es3) {
        RUN_TEST_SPEC(R"(
function a(x,y,z){};
delete a.arguments; //$boolean false
a.arguments; //$null
)");
    }


    // ES5.1, 15.3.5.2 "In Edition 5, the prototype property of Function instances is not enumerable. In Edition 3, this property was enumerable"
    RUN_TEST(L"function a(){}; s=''; for(k in a)s+=k+','; s", value{string{h, tested_version() != version::es3 ? "" : "prototype,"}});

    if (tested_version() < version::es5) {
        RUN_TEST(L"Function.prototype.bind", value::undefined);
    }

    if (tested_version() < version::es3) {
        // In ES1 prototype should be DontEnum only
        RUN_TEST(L"function a(){}; (delete a.prototype)", value{true});
        // Shouldn't have call/apply
        RUN_TEST(L"fp = Function.prototype; fp['call'] || fp['apply']", value::undefined);
        return;
    }

    // In ES3 prototype is DontDelete
    RUN_TEST(L"function a(){}; (delete a.prototype)", value{false});

    // The function identifier is DontDelete, ReadOnly
    RUN_TEST(L"function f(){ f=42; return f==42||delete f;}; f()", value{false});

    RUN_TEST_SPEC(R"(
Function.prototype.apply.length; //$number 2
function f(a,b,c) { return ''+this['x']+a+b+c; }
x=42;
f.apply(); //$string '42undefinedundefinedundefined'
f.apply(null); //$string '42undefinedundefinedundefined'
f.apply({}); //$string 'undefinedundefinedundefinedundefined'
f.apply({x:60},['a','b']); //$string '60abundefined'
f.apply({x:'z'},[1,2,3,4]); //$string 'z123'

String.prototype.charAt.apply('test',[2]); //$string 's'

String.prototype.apply = Function.prototype.apply;
try { ('h').apply(); } catch (e) {
    e.toString().toLowerCase(); //$ string 'typeerror: string is not a function'
}
)");

    RUN_TEST_SPEC(R"(
Function.prototype.call.length; //$number 1
function f(a,b,c) { return ''+this['x']+a+b+c; }
x=42;
f.call(); //$string '42undefinedundefinedundefined'
f.call(null); //$string '42undefinedundefinedundefined'
f.call({}); //$string 'undefinedundefinedundefinedundefined'
f.call({x:60},'a','b'); //$string '60abundefined'
f.call({x:'z'},1,2,3,4); //$string 'z123'

String.prototype.charAt.call('test',2); //$string 's'

String.prototype.call = Function.prototype.call;
try { ('h').call(); } catch (e) {
    e.toString().toLowerCase(); //$ string 'typeerror: string is not a function'
}
)");

    RUN_TEST_SPEC(R"(
// ES3, 15.3.2.1
try {new Function('a;b','return a+b');} catch (e) { e.toString(); } //$string 'SyntaxError: Invalid argument to function constructor'
try {new Function('a,b','*a');} catch (e) { e.toString(); } //$string 'SyntaxError: Invalid argument to function constructor'

// ES3, 11.2.2, 11.2.3
try {new 42;} catch (e) { e.toString(); } //$string 'TypeError: 42 is not an object'
try {({})();} catch (e) { e.toString(); } //$string 'TypeError: Object is not a function'
try {42();} catch (e) { e.toString(); } //$string 'TypeError: 42 is not a function'

// ES3, 15.3.4.2
try { Function.prototype.toString.call(42); } catch (e) { e.toString().toLowerCase(); } //$string 'typeerror: number is not a function'

// ES3, 15.3.4.3
o = {}
o.apply = Function.prototype.apply;
try { o.apply(); } catch (e) { e.toString(); } //$string 'TypeError: Object is not a function'

function g(a,b) { return '('+a+';'+b+')'; }
function f() { return g.apply(null, arguments); }
f(1,2); //$string '(1;2)'
g.apply(null, [3,4]); //$string '(3;4)'

// ES3, 15.3.4.4
o = {}
o.call = Function.prototype.call;
try { o.call(); } catch (e) { e.toString(); } //$string 'TypeError: Object is not a function'

// ES3, 15.3.5.3
function f() {}
fi = new f();
fi instanceof f; //$boolean true
f.prototype = undefined;
try { fi instanceof f; } catch (e) { e.toString(); } //$string 'TypeError: Function has non-object prototype of type undefined in instanceof check'
)");

    const wchar_t* const apply_normal_object = L"try { Number.prototype.toString.apply(42, {'length':1,0:16}); } catch (e) { e.toString(); }";
    if (tested_version() < version::es5) {
        // In ES3 the second argument to Function.prototype.apply must be an Arguments object or an Array.
        RUN_TEST(apply_normal_object, value{string{h, "TypeError: Object is not an (arguments) array"}});
    } else {
        // ES5.1, 15.3.4.3 the second argument to apply can be any object with a length property
        RUN_TEST(apply_normal_object, value{string{h, "2a"}});
    }

    // Function.prototype.bind
    if (tested_version() >= version::es5) {

        RUN_TEST_SPEC(R"(
Function.prototype.bind.length;//$number 1
try { Function.prototype.bind.call(new String(''),42); } catch (e) { e.toString(); } //$string 'TypeError: String is not a function'
function f(){};
f.prototype = Function.prototype;
var fi = new f();
try { fi.bind(); } catch (e) { e.toString(); } //$string 'TypeError: f is not a function'

r = (function(){return this}).bind()(); r === global; //$boolean true
r = (function(){return this}).bind()(undefined); r === global; //$boolean true
r = (function(){return this}).bind()(null); r === global; //$boolean true
a=(function(){return this}).bind(42);
a.length;//$number 0
r=a(); r instanceof Number; //$boolean true
r.valueOf(); //$ number 42
add1=(function(x,y){return x+y;}).bind(undefined,1);
add1(42);//$number 43
add1('x ');//$string '1x '
add1.length;//$number 1
add12=add1.bind(2,3);
add12(4); //$number 4
add12.length;//$number 0
add12x=add12.bind(4,5);
add12x(4); //$number 4
add12x.length;//$number 0

add2=(function(x,y){return x+y;}).bind(undefined,1,2,3);
add2(42); //$number 3
add2.length; //$number 0

function fmt(v) { return v+':'+typeof v; }
function fmtall(o) { var r = '{'; var p = Object.getOwnPropertyNames(o);for(var i=0;i<p.length;++i) { r+=' '+p[i]+'='+fmt(o[p[i]]); }; return r+'}'; }
function f(a,b) { s+='this='+fmtall(this)+',arguments='+fmtall(arguments); this.x=a; this.y=b; };
s = ''; x = f.bind(new String('x'),new String('y'));
s; //$string ''
r=new x(42,43,44);
s; //$string 'this={},arguments={ length=4:number 0=y:object 1=42:number 2=43:number 3=44:number callee=function f(a,b) { s+=\'this=\'+fmtall(this)+\',arguments=\'+fmtall(arguments); this.x=a; this.y=b; }:function}'
r instanceof f; //$boolean true
fmtall(r); //$string '{ x=y:object y=42:number}'
)");

        RUN_TEST_SPEC(R"(
try { (function(){'use strict'; return arguments.callee;})() } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
try { (function(){'use strict'; arguments.callee = 42;})()   } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
try { (function(){'use strict'; return arguments.caller;})() } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
try { (function(){'use strict'; arguments.caller = 42;})()   } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'

function f(){};
(function(){'use strict'; f.callee=42; return f.callee; })(); //$number 42
(function(){'use strict'; f.caller=55; return f.caller; })(); //$number 55

(function(){
    'use strict';
    function g(){};
    try { g.arguments;      } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
    try { g.arguments = 42; } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
    try { g.caller;         } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
    try { g.caller = 42;    } catch (e) { e.toString(); } //$string 'TypeError: Property may not be accessed in strict mode'
})();

)");
    }

    //
    // Check the value of 'this' in strict-mode functions 
    //
    if (tested_version() >= version::es5) {
        RUN_TEST_SPEC(R"(
(function() {
    'use strict';
    var q;
    Object.defineProperty(Number.prototype, 'foo', {
        configurable: true,
        get: function() { return this; },
        set: function() { q=this; },
    });
    var x = 60;
    x.foo; //$number 60
    q;//$undefined
    x.foo *= 2;
    q;//$number 60
})();

(function() {
    'use strict';
    var q;
    Object.defineProperty(Boolean.prototype, 'foo', {
        configurable: true,
        get: function() { return this; },
        set: function() { q=this; },
    });
    var x = true;
    x.foo; //$boolean true
    q;//$undefined
    x.foo *= 2;
    q;//$boolean true
})();

(function() {
    'use strict';
    var q;
    Object.defineProperty(String.prototype, 'foo', {
        configurable: true,
        get: function() { return this; },
        set: function() { q=this; },
    });
    var x = 'test';
    x.foo; //$string 'test'
    q;//$undefined
    x.foo *= 2;
    q;//$string 'test'
})();

function f() { "use strict"; return this; }
f(); //$undefined
f(undefined); //$undefined
Number.prototype.toString = f;
n=(42+1).toString();
typeof n; //$string 'number'
n === 43; //$boolean true
n.valueOf(); //$number 43

f.apply(); //$undefined
f.apply(undefined); //$undefined
// maybe undefined???
f.apply(null); //$null
f.apply(false); //$boolean false
f.apply(60); //$number 60
f.apply('x'); //$string 'x'

f.call(); //$undefined
f.call(undefined); //$undefined
f.call(null); //$null
f.call(false); //$boolean false
f.call(60); //$number 60
f.call('x'); //$string 'x'
)");

    }
}